

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

void __thiscall CNetTokenCache::~CNetTokenCache(CNetTokenCache *this)

{
  undefined8 uVar1;
  long in_RDI;
  CConnlessPacketInfo *pTemp;
  
  while (*(long *)(in_RDI + 0xa28) != 0) {
    uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0xa28) + 0x5b8);
    if (*(void **)(in_RDI + 0xa28) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0xa28),0x5c0);
    }
    *(undefined8 *)(in_RDI + 0xa28) = uVar1;
  }
  *(undefined8 *)(in_RDI + 0xa28) = 0;
  return;
}

Assistant:

CNetTokenCache::~CNetTokenCache()
{
	// delete the linked list
	while(m_pConnlessPacketList)
	{
		CConnlessPacketInfo *pTemp = m_pConnlessPacketList->m_pNext;
		delete m_pConnlessPacketList;
		m_pConnlessPacketList = pTemp;
	}
	m_pConnlessPacketList = 0;
}